

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_program_info_log.h
# Opt level: O2

bool print_program_info_log(GLuint obj)

{
  GLint GVar1;
  char *pcVar2;
  ostream *poVar3;
  GLint charsWritten;
  GLint infologLength;
  string log;
  allocator local_1fd;
  GLsizei local_1fc;
  string local_1f8;
  string local_1d8;
  GLint local_1b4;
  string local_1b0;
  allocator local_190 [376];
  
  local_1b4 = 0;
  local_1fc = 0;
  (*glad_glGetProgramiv)(obj,0x8b84,&local_1b4);
  GVar1 = local_1b4;
  if (0 < (long)local_1b4) {
    pcVar2 = (char *)operator_new__((long)local_1b4);
    (*glad_glGetProgramInfoLog)(obj,GVar1,&local_1fc,pcVar2);
    std::__cxx11::string::string((string *)&local_1b0,pcVar2,local_190);
    std::__cxx11::string::string((string *)&local_1d8,"ERROR",&local_1fd);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    poVar3 = (ostream *)std::ostream::flush();
    poVar3 = std::operator<<(poVar3,"\x1b[1m\x1b[31m");
    poVar3 = std::operator<<(poVar3,"ERROR");
    std::operator<<(poVar3,"\x1b[m");
    std::__cxx11::stringbuf::str();
    find_and_replace_all(&local_1d8,&local_1f8,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string((string *)&local_1d8,"WARNING",&local_1fd);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    poVar3 = (ostream *)std::ostream::flush();
    poVar3 = std::operator<<(poVar3,"\x1b[1m\x1b[33m");
    poVar3 = std::operator<<(poVar3,"WARNING");
    std::operator<<(poVar3,"\x1b[m");
    std::__cxx11::stringbuf::str();
    find_and_replace_all(&local_1d8,&local_1f8,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::__cxx11::string::~string((string *)&local_1d8);
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&local_1b0);
    std::endl<char,std::char_traits<char>>(poVar3);
    operator_delete__(pcVar2);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  return 0 < GVar1;
}

Assistant:

bool print_program_info_log(const GLuint obj)
{
  GLint infologLength = 0;
  GLint charsWritten  = 0;
  
  glGetProgramiv(obj, GL_INFO_LOG_LENGTH,&infologLength);
  
  if (infologLength > 0)
  {
    char * infoLog = new char[infologLength];
    glGetProgramInfoLog(obj, infologLength, &charsWritten, infoLog);
    std::string log(infoLog);
    find_and_replace_all("ERROR",STR(REDRUM("ERROR")),log);
    find_and_replace_all("WARNING",STR(YELLOWRUM("WARNING")),log);
    std::cerr<<log<<std::endl;
    delete[] infoLog;
    return true;
  }
  return false;
}